

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O1

bool __thiscall
boost::detail::function::basic_vtable0<void>::
assign_to<boost::_bi::bind_t<void,boost::_mfi::mf0<void,boost::unit_test::test_unit_fixture>,boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>>>>>
          (undefined8 param_1,undefined8 *f,undefined8 *functor)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  shared_count local_20 [2];
  
  uVar2 = *f;
  uVar3 = f[1];
  uVar1 = f[2];
  local_20[0].pi_ = (sp_counted_base *)f[3];
  if (local_20[0].pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_20[0].pi_)->use_count_ = (local_20[0].pi_)->use_count_ + 1;
    UNLOCK();
  }
  puVar4 = (undefined8 *)operator_new(0x20);
  *puVar4 = uVar2;
  puVar4[1] = uVar3;
  puVar4[2] = uVar1;
  puVar4[3] = local_20[0].pi_;
  if (local_20[0].pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_20[0].pi_)->use_count_ = (local_20[0].pi_)->use_count_ + 1;
    UNLOCK();
  }
  *functor = puVar4;
  shared_count::~shared_count(local_20);
  return true;
}

Assistant:

bool
        assign_to(FunctionObj f, function_buffer& functor, function_obj_tag) const
        {
          if (!boost::detail::function::has_empty_target(boost::addressof(f))) {
            assign_functor(f, functor,
                           mpl::bool_<(function_allows_small_object_optimization<FunctionObj>::value)>());
            return true;
          } else {
            return false;
          }
        }